

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsIterationIllegal(void)

{
  ostream *poVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> local_60;
  Span<const_int,_18446744073709551615UL> local_48;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> local_38;
  
  local_38.m_begin.m_ptr = (pointer)0x200000001;
  local_38.m_begin.m_stride = 0x400000003;
  local_38.m_end.m_ptr = (pointer)0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_48);
  local_48.m_ptr = (pointer)0x0;
  if ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_48.m_ptr =
         local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_48.m_size.m_size =
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices(&local_38,&local_48,5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x241);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,": expected exception, but none thrown.\n",0x27);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 1;
}

Assistant:

int testSpanTestsIterationIllegal()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);
    ML_ASSERT_THROWS(span.IterateSlices(5), std::range_error);

    return 0;
}